

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_test.cpp
# Opt level: O0

void doTest(TestStartupParamsAndResults *startupParams)

{
  thread *local_f70;
  thread *local_f58;
  ThreadTestRes *local_f50;
  size_t i_2;
  thread local_f40;
  thread t1;
  ThreadTestRes *local_f28;
  size_t i_1;
  size_t i;
  thread threads [32];
  ThreadStartupParamsAndResults testParams [32];
  size_t testThreadCount;
  TestStartupParamsAndResults *startupParams_local;
  
  testParams[0x1f].threadResPerThreadAlloc =
       (ThreadTestRes *)(startupParams->startupParams).threadCount;
  local_f58 = (thread *)&i;
  do {
    std::thread::thread(local_f58);
    local_f58 = local_f58 + 1;
  } while (local_f58 != threads + 0x1f);
  for (i_1 = 0; i_1 < testParams[0x1f].threadResPerThreadAlloc; i_1 = i_1 + 1) {
    memcpy(&testParams[i_1 - 1].threadResPerThreadAlloc,startupParams,0x50);
    *(size_t *)&testParams[i_1].startupParams.mat = i_1;
    testParams[i_1].threadID = (size_t)(startupParams->testRes->threadResEmpty + i_1);
    testParams[i_1].threadResEmpty = startupParams->testRes->threadResNewDel + i_1;
    testParams[i_1].threadResNewDel = startupParams->testRes->threadResPerThreadAlloc + i_1;
  }
  for (local_f28 = (ThreadTestRes *)0x0; local_f28 < testParams[0x1f].threadResPerThreadAlloc;
      local_f28 = (ThreadTestRes *)((long)&(local_f28->super_CommonTestResults).threadID + 1)) {
    nodecpp::log::default_log::info<char_const*,unsigned_long>
              ("about to run thread {}...",(unsigned_long)local_f28);
    i_2 = (size_t)&testParams[(long)((long)&local_f28[-1].deallocRequestCountAfterExit + 7)].
                   threadResPerThreadAlloc;
    std::thread::thread<void*(&)(void*),void*,void>(&local_f40,runRandomTest,(void **)&i_2);
    std::thread::operator=
              (threads + (long)((long)&local_f28[-1].deallocRequestCountAfterExit + 7),&local_f40);
    nodecpp::log::default_log::info<char_const*>("    ...done");
    std::thread::~thread(&local_f40);
  }
  for (local_f50 = (ThreadTestRes *)0x0; local_f50 < testParams[0x1f].threadResPerThreadAlloc;
      local_f50 = (ThreadTestRes *)((long)&(local_f50->super_CommonTestResults).threadID + 1)) {
    nodecpp::log::default_log::info<char_const*,unsigned_long>
              ("joining thread {}...",(unsigned_long)local_f50);
    std::thread::join();
    nodecpp::log::default_log::info<char_const*>("    ...done");
  }
  local_f70 = threads + 0x1f;
  do {
    local_f70 = local_f70 + -1;
    std::thread::~thread(local_f70);
  } while (local_f70 != (thread *)&i);
  return;
}

Assistant:

void doTest( TestStartupParamsAndResults* startupParams )
{
	size_t testThreadCount = startupParams->startupParams.threadCount;

	ThreadStartupParamsAndResults testParams[max_threads];
	std::thread threads[ max_threads ];

	for ( size_t i=0; i<testThreadCount; ++i )
	{
		memcpy( testParams + i, startupParams, sizeof(TestStartupParams) );
		testParams[i].threadID = i;
		testParams[i].threadResEmpty = startupParams->testRes->threadResEmpty + i;
		testParams[i].threadResNewDel = startupParams->testRes->threadResNewDel + i;
		testParams[i].threadResPerThreadAlloc = startupParams->testRes->threadResPerThreadAlloc + i;
	}

	// run thread
	for ( size_t i=0; i<testThreadCount; ++i )
	{
		nodecpp::log::default_log::info( "about to run thread {}...", i );
		std::thread t1( runRandomTest, (void*)(testParams + i) );
		threads[i] = std::move( t1 );
//		t1.detach();
		nodecpp::log::default_log::info( "    ...done" );
	}
	// join threads
	for ( size_t i=0; i<testThreadCount; ++i )
	{
		nodecpp::log::default_log::info( "joining thread {}...", i );
		threads[i].join();
		nodecpp::log::default_log::info( "    ...done" );
	}
}